

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O0

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemStatic>::build_object
          (Mem<r_exec::LObject,_r_exec::MemStatic> *this,Atom *head)

{
  char cVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  undefined4 extraout_var;
  Atom *pAVar5;
  uint16_t opcode;
  LObject *local_20;
  Code *object;
  Atom *head_local;
  Mem<r_exec::LObject,_r_exec::MemStatic> *this_local;
  
  pAVar5 = head;
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x38) {
    local_20 = (LObject *)operator_new(0x448);
    r_exec::Group::Group((Group *)local_20,(Mem *)0x0);
  }
  else {
    sVar3 = r_code::Atom::asOpcode();
    if (sVar3 == (short)Opcodes::Fact) {
      local_20 = (LObject *)r_exec::Fact::operator_new((Fact *)0x150,(ulong)pAVar5);
      r_exec::Fact::Fact((Fact *)local_20);
    }
    else if (sVar3 == (short)Opcodes::AntiFact) {
      local_20 = (LObject *)r_exec::AntiFact::operator_new((AntiFact *)0x150,(ulong)pAVar5);
      r_exec::AntiFact::AntiFact((AntiFact *)local_20);
    }
    else if (sVar3 == (short)Opcodes::Pred) {
      local_20 = (LObject *)operator_new(0x180);
      r_exec::Pred::Pred((Pred *)local_20);
    }
    else if (sVar3 == (short)Opcodes::Goal) {
      local_20 = (LObject *)operator_new(0x160);
      r_exec::Goal::Goal((Goal *)local_20);
    }
    else if (sVar3 == (short)Opcodes::ICst) {
      local_20 = (LObject *)operator_new(0x170);
      r_exec::ICST::ICST((ICST *)local_20);
    }
    else if (sVar3 == (short)Opcodes::MkRdx) {
      local_20 = (LObject *)operator_new(0x158);
      r_exec::MkRdx::MkRdx((MkRdx *)local_20);
    }
    else if ((((((sVar3 == (short)Opcodes::MkActChg) || (sVar3 == (short)Opcodes::MkHighAct)) ||
               (sVar3 == (short)Opcodes::MkHighSln)) ||
              ((sVar3 == (short)Opcodes::MkLowAct || (sVar3 == (short)Opcodes::MkLowRes)))) ||
             ((sVar3 == (short)Opcodes::MkLowSln ||
              ((sVar3 == (short)Opcodes::MkNew || (sVar3 == (short)Opcodes::MkSlnChg)))))) ||
            ((sVar3 == (short)Opcodes::Success || (sVar3 == (short)Opcodes::Perf)))) {
      local_20 = (LObject *)operator_new(200);
      r_code::LObject::LObject(local_20);
    }
    else {
      bVar2 = LObject::RequiresPacking();
      if (bVar2) {
        local_20 = (LObject *)operator_new(200);
        r_code::LObject::LObject(local_20);
      }
      else {
        local_20 = (LObject *)operator_new(0x150);
        LObject::LObject((LObject *)local_20,(Mem *)0x0);
      }
    }
  }
  iVar4 = (*(local_20->super_Code).super__Object._vptr__Object[4])(local_20,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar4),head);
  return &local_20->super_Code;
}

Assistant:

r_code::Code *Mem<O, S>::build_object(Atom head) const
{
    r_code::Code *object;

    switch (head.getDescriptor()) {
    case Atom::GROUP:
        object = new Group();
        break;

    default: {
        uint16_t opcode = head.asOpcode();

        if (opcode == Opcodes::Fact) {
            object = new Fact();
        } else if (opcode == Opcodes::AntiFact) {
            object = new AntiFact();
        } else if (opcode == Opcodes::Pred) {
            object = new Pred();
        } else if (opcode == Opcodes::Goal) {
            object = new Goal();
        } else if (opcode == Opcodes::ICst) {
            object = new ICST();
        } else if (opcode == Opcodes::MkRdx) {
            object = new MkRdx();
        } else if (opcode == Opcodes::MkActChg ||
                   opcode == Opcodes::MkHighAct ||
                   opcode == Opcodes::MkHighSln ||
                   opcode == Opcodes::MkLowAct ||
                   opcode == Opcodes::MkLowRes ||
                   opcode == Opcodes::MkLowSln ||
                   opcode == Opcodes::MkNew ||
                   opcode == Opcodes::MkSlnChg ||
                   opcode == Opcodes::Success ||
                   opcode == Opcodes::Perf) {
            object = new r_code::LObject();
        } else if (O::RequiresPacking()) {
            object = new r_code::LObject();    // temporary sand box for assembling code; will be packed into an O at injection time.
        } else {
            object = new O();
        }

        break;
    }
    }

    object->code(0) = head;
    return object;
}